

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void SstFFSSetZFPParams(SstStream Stream,attr_list Attrs)

{
  long lVar1;
  undefined8 in_RSI;
  long in_RDI;
  FFSWriterMarshalBase *Info;
  
  if (*(long *)(in_RDI + 0x1c0) != 0) {
    lVar1 = *(long *)(in_RDI + 0x1c0);
    if (*(long *)(lVar1 + 0x70) != 0) {
      free_attr_list(*(undefined8 *)(lVar1 + 0x70));
    }
    add_ref_attr_list(in_RSI);
    *(undefined8 *)(lVar1 + 0x70) = in_RSI;
  }
  return;
}

Assistant:

extern void SstFFSSetZFPParams(SstStream Stream, attr_list Attrs)
{
    if (Stream->WriterMarshalData)
    {
        struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;
        if (Info->ZFPParams)
            free_attr_list(Info->ZFPParams);
        add_ref_attr_list(Attrs);
        Info->ZFPParams = Attrs;
    }
}